

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::EnumDescriptorTest_ValueName_Test::TestBody
          (EnumDescriptorTest_ValueName_Test *this)

{
  string *psVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AssertHelper AStack_38;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  internal local_20 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  psVar1 = ((this->super_EnumDescriptorTest).foo_)->all_names_;
  local_30._M_str = (psVar1->_M_dataplus)._M_p;
  local_30._M_len = psVar1->_M_string_length;
  testing::internal::CmpHelperEQ<char[4],std::basic_string_view<char,std::char_traits<char>>>
            (local_20,"\"FOO\"","foo_->name()",(char (*) [4])0x112e715,&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x702,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_30._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_len + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  psVar1 = ((this->super_EnumDescriptorTest).bar_)->all_names_;
  local_30._M_str = (psVar1->_M_dataplus)._M_p;
  local_30._M_len = psVar1->_M_string_length;
  testing::internal::CmpHelperEQ<char[4],std::basic_string_view<char,std::char_traits<char>>>
            (local_20,"\"BAR\"","bar_->name()",(char (*) [4])0x112e727,&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x703,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_30._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_len + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  return;
}

Assistant:

TEST_F(EnumDescriptorTest, ValueName) {
  EXPECT_EQ("FOO", foo_->name());
  EXPECT_EQ("BAR", bar_->name());
}